

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

bool __thiscall graph::isEdge(graph *this,restaurant *from,restaurant *to)

{
  unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  mapped_type *__x;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  ulong uVar6;
  bool bVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> adj;
  restaurant *local_48;
  restaurant *local_40;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_38;
  
  this_00 = &this->mapper;
  local_48 = to;
  local_40 = from;
  pmVar3 = std::__detail::
           _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_40);
  p_Var4 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->v)._M_t._M_impl.super__Rb_tree_header;
    iVar2 = *pmVar3;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var4[1]._M_color) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= iVar2)) {
      pmVar3 = std::__detail::
               _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_48);
      p_Var4 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 != (_Base_ptr)0x0) {
        iVar2 = *pmVar3;
        p_Var5 = &p_Var1->_M_header;
        do {
          if (iVar2 <= (int)*(size_t *)(p_Var4 + 1)) {
            p_Var5 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < iVar2];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var5)->_M_node_count <= iVar2)) {
          pmVar3 = std::__detail::
                   _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&local_40);
          __x = std::__detail::
                _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this,pmVar3);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    (&local_38,__x);
          if (local_38.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_38.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            bVar7 = false;
          }
          else {
            uVar6 = 0;
            do {
              iVar2 = local_38.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].first;
              pmVar3 = std::__detail::
                       _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_48);
              bVar7 = iVar2 == *pmVar3;
              if (bVar7) break;
              uVar6 = uVar6 + 1;
            } while (uVar6 < (ulong)((long)local_38.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_38.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_38.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start == (pointer)0x0) {
            return bVar7;
          }
          operator_delete(local_38.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          return bVar7;
        }
      }
    }
  }
  return false;
}

Assistant:

bool graph::isEdge(restaurant *from, restaurant *to)
{
    if (v.find(mapper[from]) == v.end() || v.find(mapper[to]) == v.end())
    {
        return false;
    }
    vector<pair<int, int>> adj = theGraph[mapper[from]];
    for (int i = 0; i < adj.size(); i++)
    {
        if (adj[i].first == mapper[to])
        {
            return true;
        }
    }
    return false;
}